

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segdmp.c
# Opt level: O1

int segdmp_close(void)

{
  if (frm_buf != (char *)0x0) {
    dump_frm_buf();
  }
  ckd_free(id_part);
  id_part = (uint32 *)0x0;
  ckd_free(id_off);
  id_off = (uint32 *)0x0;
  ckd_free(id_len);
  id_len = (uint32 *)0x0;
  ckd_free(dmp_fp);
  dmp_fp = (FILE **)0x0;
  ckd_free(frm_buf);
  frm_buf = (char *)0x0;
  ckd_free(h_seg);
  h_seg = (seg_t **)0x0;
  ckd_free(t_seg);
  t_seg = (seg_t **)0x0;
  return 0;
}

Assistant:

int
segdmp_close()
{
    if (frm_buf)
	dump_frm_buf();

    ckd_free(id_part);
    id_part = NULL;

    ckd_free(id_off);
    id_off = NULL;

    ckd_free(id_len);
    id_len = NULL;

    ckd_free(dmp_fp);
    dmp_fp = NULL;

    ckd_free(frm_buf);
    frm_buf = NULL;

    ckd_free(h_seg);
    h_seg = NULL;

    ckd_free(t_seg);
    t_seg = NULL;

    return S3_SUCCESS;
}